

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O0

vi2d __thiscall olc::TransformedView::ScaleToScreen(TransformedView *this,vf2d *vWorldSize)

{
  v2d_generic<float> *in_RDX;
  v2d_generic<float> __x;
  v2d_generic<float> local_30;
  v2d_generic<float> local_28;
  vf2d vFloat;
  vf2d *vWorldSize_local;
  TransformedView *this_local;
  
  __x = v2d_generic<float>::operator*(&local_28,in_RDX);
  v2d_generic<float>::floor(&local_30,(double)__x);
  v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)this);
  return (vi2d)this;
}

Assistant:

olc::vi2d TransformedView::ScaleToScreen(const olc::vf2d& vWorldSize) const
	{
		olc::vf2d vFloat = vWorldSize * m_vWorldScale;		
		return vFloat.floor();
	}